

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

mat4 * rengine::TransformNode::matrixFor(mat4 *__return_storage_ptr__,Node *descendant,Node *root)

{
  long lVar1;
  long lVar2;
  mat4 *pmVar3;
  float *pfVar4;
  mat4 *pmVar5;
  float *pfVar6;
  undefined1 *puVar7;
  byte bVar8;
  mat4 in_stack_fffffffffffffef8;
  mat4 local_bc;
  float local_78 [18];
  
  bVar8 = 0;
  __return_storage_ptr__->m[0xc] = 0.0;
  __return_storage_ptr__->m[0xd] = 0.0;
  __return_storage_ptr__->m[0xe] = 0.0;
  __return_storage_ptr__->m[0xf] = 1.0;
  __return_storage_ptr__->m[8] = 0.0;
  __return_storage_ptr__->m[9] = 0.0;
  __return_storage_ptr__->m[10] = 1.0;
  __return_storage_ptr__->m[0xb] = 0.0;
  __return_storage_ptr__->m[4] = 0.0;
  __return_storage_ptr__->m[5] = 1.0;
  __return_storage_ptr__->m[6] = 0.0;
  __return_storage_ptr__->m[7] = 0.0;
  __return_storage_ptr__->m[0] = 1.0;
  __return_storage_ptr__->m[1] = 0.0;
  __return_storage_ptr__->m[2] = 0.0;
  __return_storage_ptr__->m[3] = 0.0;
  __return_storage_ptr__->type = 0;
  while( true ) {
    if ((descendant != (Node *)0x0) && (descendant->field_0x30 == '\x01')) {
      lVar2 = 0x11;
      pfVar4 = (float *)&descendant->field_0x34;
      pmVar5 = &local_bc;
      for (lVar1 = lVar2; pmVar3 = __return_storage_ptr__, pfVar6 = local_78, lVar1 != 0;
          lVar1 = lVar1 + -1) {
        pmVar5->m[0] = *pfVar4;
        pfVar4 = pfVar4 + (ulong)bVar8 * -2 + 1;
        pmVar5 = (mat4 *)((long)pmVar5 + (ulong)bVar8 * -8 + 4);
      }
      for (; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pfVar6 = pmVar3->m[0];
        pmVar3 = (mat4 *)((long)pmVar3 + (ulong)bVar8 * -8 + 4);
        pfVar6 = pfVar6 + (ulong)bVar8 * -2 + 1;
      }
      pfVar4 = local_78;
      puVar7 = &stack0xfffffffffffffef8;
      for (lVar2 = 0x44; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar7 = *(undefined1 *)pfVar4;
        pfVar4 = (float *)((long)pfVar4 + (ulong)bVar8 * -2 + 1);
        puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
      }
      mat4::operator*(__return_storage_ptr__,&local_bc,in_stack_fffffffffffffef8);
    }
    if (descendant == root) break;
    descendant = descendant->m_parent;
    if (descendant == (Node *)0x0 && root != (Node *)0x0) {
      __assert_fail("root == nullptr || n != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                    ,0x188,"static mat4 rengine::TransformNode::matrixFor(Node *, Node *)");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static mat4 matrixFor(Node *descendant, Node *root = 0) {
        Node *n = descendant;
        mat4 m;
        while (true) {
            if (TransformNode *tn = TransformNode::from(n)) {
                m = tn->matrix() * m;
            }
            if (n == root)
                break;
            n = n->parent();
            assert(root == nullptr || n != nullptr);
        }
        return m;
    }